

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void QApplicationPrivate::initializeWidgetFontHash(void)

{
  QPlatformTheme *pQVar1;
  DataPointer *dd;
  long lVar2;
  long in_FS_OFFSET;
  QFont *font_21;
  QFont *font_20;
  QFont *font_19;
  QFont *font_18;
  QFont *font_17;
  QFont *font_16;
  QFont *font_15;
  QFont *font_14;
  QFont *font_13;
  QFont *font_12;
  QFont *font_11;
  QFont *font_10;
  QFont *font_9;
  QFont *font_8;
  QFont *font_7;
  QFont *font_6;
  QFont *font_5;
  QFont *font_4;
  QFont *font_3;
  QFont *font_2;
  QFont *font_1;
  QFont *font;
  FontHash *fontHash;
  QPlatformTheme *theme;
  DataPointer *in_stack_fffffffffffff908;
  DataPointer *in_stack_fffffffffffff910;
  QArrayDataPointer<char> local_428 [2];
  QArrayDataPointer<char> local_3f8 [2];
  QArrayDataPointer<char> local_3c8 [2];
  QArrayDataPointer<char> local_398 [2];
  QArrayDataPointer<char> local_368 [2];
  QArrayDataPointer<char> local_338 [2];
  QArrayDataPointer<char> local_308 [2];
  QArrayDataPointer<char> local_2d8 [2];
  QArrayDataPointer<char> local_2a8 [2];
  QArrayDataPointer<char> local_278 [2];
  QArrayDataPointer<char> local_248 [2];
  QArrayDataPointer<char> local_218 [2];
  QArrayDataPointer<char> local_1e8 [2];
  QArrayDataPointer<char> local_1b8 [2];
  QArrayDataPointer<char> local_188 [2];
  QArrayDataPointer<char> local_158 [2];
  QArrayDataPointer<char> local_128 [2];
  QArrayDataPointer<char> local_f8 [2];
  QArrayDataPointer<char> local_c8 [2];
  QArrayDataPointer<char> local_98 [2];
  QArrayDataPointer<char> local_68 [2];
  QArrayDataPointer<char> local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QGuiApplicationPrivate::platformTheme();
  if (pQVar1 != (QPlatformTheme *)0x0) {
    dd = (DataPointer *)
         QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>::operator()
                   ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>
                     *)in_stack_fffffffffffff908);
    QHash<QByteArray,_QFont>::clear((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910);
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,1);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_38,(Data *)0x0,"QMenu",5);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c8a63);
      QByteArray::~QByteArray((QByteArray *)0x2c8a80);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,2);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_68,(Data *)0x0,"QMenuBar",8);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c8b16);
      QByteArray::~QByteArray((QByteArray *)0x2c8b33);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,3);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_98,(Data *)0x0,"QMenuItem",9);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c8bc9);
      QByteArray::~QByteArray((QByteArray *)0x2c8be6);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,4);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_c8,(Data *)0x0,"QMessageBox",0xb);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c8c7c);
      QByteArray::~QByteArray((QByteArray *)0x2c8c99);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,5);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_f8,(Data *)0x0,"QLabel",6);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c8d2f);
      QByteArray::~QByteArray((QByteArray *)0x2c8d4c);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,6);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_128,(Data *)0x0,"QTipLabel",9);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c8de2);
      QByteArray::~QByteArray((QByteArray *)0x2c8dff);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,8);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_158,(Data *)0x0,"QTitleBar",9);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c8e8f);
      QByteArray::~QByteArray((QByteArray *)0x2c8eac);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,7);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_188,(Data *)0x0,"QStatusBar",10);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c8f3c);
      QByteArray::~QByteArray((QByteArray *)0x2c8f59);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,9);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_1b8,(Data *)0x0,"QMdiSubWindowTitleBar",0x15)
      ;
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c8fe9);
      QByteArray::~QByteArray((QByteArray *)0x2c9006);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,10);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_1e8,(Data *)0x0,"QDockWidgetTitle",0x10);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c9096);
      QByteArray::~QByteArray((QByteArray *)0x2c90b3);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,0xb);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_218,(Data *)0x0,"QPushButton",0xb);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c9143);
      QByteArray::~QByteArray((QByteArray *)0x2c9160);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,0xc);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_248,(Data *)0x0,"QCheckBox",9);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c91f0);
      QByteArray::~QByteArray((QByteArray *)0x2c920d);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,0xd);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_278,(Data *)0x0,"QRadioButton",0xc);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c929d);
      QByteArray::~QByteArray((QByteArray *)0x2c92ba);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,0xe);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_2a8,(Data *)0x0,"QToolButton",0xb);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c934a);
      QByteArray::~QByteArray((QByteArray *)0x2c9367);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,0xf);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_2d8,(Data *)0x0,"QAbstractItemView",0x11);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c93f7);
      QByteArray::~QByteArray((QByteArray *)0x2c9414);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,0x10);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_308,(Data *)0x0,"QListView",9);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c94a4);
      QByteArray::~QByteArray((QByteArray *)0x2c94c1);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,0x11);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_338,(Data *)0x0,"QHeaderView",0xb);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c9551);
      QByteArray::~QByteArray((QByteArray *)0x2c956e);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,0x12);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_368,(Data *)0x0,"QListBox",8);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c95fe);
      QByteArray::~QByteArray((QByteArray *)0x2c961b);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,0x13);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_398,(Data *)0x0,"QComboMenuItem",0xe);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c96ab);
      QByteArray::~QByteArray((QByteArray *)0x2c96c8);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,0x14);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_3c8,(Data *)0x0,"QComboLineEdit",0xe);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c9758);
      QByteArray::~QByteArray((QByteArray *)0x2c9775);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,0x15);
    if (lVar2 != 0) {
      in_stack_fffffffffffff910 = dd;
      QArrayDataPointer<char>::QArrayDataPointer(local_3f8,(Data *)0x0,"QSmallFont",10);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,
                 (QByteArray *)in_stack_fffffffffffff908,(QFont *)0x2c9805);
      QByteArray::~QByteArray((QByteArray *)0x2c9822);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
    lVar2 = (**(code **)(*(long *)pQVar1 + 0x58))(pQVar1,0x16);
    if (lVar2 != 0) {
      QArrayDataPointer<char>::QArrayDataPointer(local_428,(Data *)0x0,"QMiniFont",9);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffff910,dd);
      QHash<QByteArray,_QFont>::insert
                ((QHash<QByteArray,_QFont> *)in_stack_fffffffffffff910,(QByteArray *)dd,
                 (QFont *)0x2c98b0);
      QByteArray::~QByteArray((QByteArray *)0x2c98cd);
      QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffff910);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::initializeWidgetFontHash()
{
    const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme();
    if (!theme)
        return;
    FontHash *fontHash = app_fonts();
    fontHash->clear();

    if (const QFont *font = theme->font(QPlatformTheme::MenuFont))
        fontHash->insert(QByteArrayLiteral("QMenu"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::MenuBarFont))
        fontHash->insert(QByteArrayLiteral("QMenuBar"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::MenuItemFont))
        fontHash->insert(QByteArrayLiteral("QMenuItem"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::MessageBoxFont))
        fontHash->insert(QByteArrayLiteral("QMessageBox"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::LabelFont))
        fontHash->insert(QByteArrayLiteral("QLabel"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::TipLabelFont))
        fontHash->insert(QByteArrayLiteral("QTipLabel"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::TitleBarFont))
        fontHash->insert(QByteArrayLiteral("QTitleBar"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::StatusBarFont))
        fontHash->insert(QByteArrayLiteral("QStatusBar"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::MdiSubWindowTitleFont))
        fontHash->insert(QByteArrayLiteral("QMdiSubWindowTitleBar"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::DockWidgetTitleFont))
        fontHash->insert(QByteArrayLiteral("QDockWidgetTitle"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::PushButtonFont))
        fontHash->insert(QByteArrayLiteral("QPushButton"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::CheckBoxFont))
        fontHash->insert(QByteArrayLiteral("QCheckBox"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::RadioButtonFont))
        fontHash->insert(QByteArrayLiteral("QRadioButton"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::ToolButtonFont))
        fontHash->insert(QByteArrayLiteral("QToolButton"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::ItemViewFont))
        fontHash->insert(QByteArrayLiteral("QAbstractItemView"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::ListViewFont))
        fontHash->insert(QByteArrayLiteral("QListView"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::HeaderViewFont))
        fontHash->insert(QByteArrayLiteral("QHeaderView"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::ListBoxFont))
        fontHash->insert(QByteArrayLiteral("QListBox"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::ComboMenuItemFont))
        fontHash->insert(QByteArrayLiteral("QComboMenuItem"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::ComboLineEditFont))
        fontHash->insert(QByteArrayLiteral("QComboLineEdit"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::SmallFont))
        fontHash->insert(QByteArrayLiteral("QSmallFont"), *font);
    if (const QFont *font = theme->font(QPlatformTheme::MiniFont))
        fontHash->insert(QByteArrayLiteral("QMiniFont"), *font);
}